

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O1

void __thiscall
Kss_Emu::set_voice(Kss_Emu *this,int i,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right)

{
  osc_t *poVar1;
  
  if (i < 3) {
    poVar1 = (this->ay).oscs + i;
  }
  else {
    poVar1 = (osc_t *)((this->scc).oscs + (i + -3));
  }
  poVar1->output = center;
  if (i < 4 && this->sn != (Sms_Apu *)0x0) {
    Sms_Apu::osc_output(this->sn,i,center,left,right);
    return;
  }
  return;
}

Assistant:

void Kss_Emu::set_voice( int i, Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	int i2 = i - ay.osc_count;
	if ( i2 >= 0 )
		scc.osc_output( i2, center );
	else
		ay.osc_output( i, center );
	if ( sn && i < sn->osc_count )
		sn->osc_output( i, center, left, right );
}